

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::testCaseEnded
          (CumulativeReporterBase<Catch::SonarQubeReporter> *this,TestCaseStats *testCaseStats)

{
  string *psVar1;
  element_type *peVar2;
  long in_RSI;
  shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>
  node;
  value_type *in_stack_ffffffffffffffb8;
  __shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  TestCaseStats *in_stack_ffffffffffffffd8;
  __shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  long local_10;
  
  this_00 = &local_20;
  local_10 = in_RSI;
  std::
  make_shared<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,Catch::TestCaseStats_const&>
            (in_stack_ffffffffffffffd8);
  clara::std::
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1660e6);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
  ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffffb8);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
  ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  clara::std::
  __shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
  ::reset(this_00);
  psVar1 = (string *)(local_10 + 0xe8);
  peVar2 = clara::std::
           __shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16614a);
  std::__cxx11::string::operator=((string *)&peVar2->stdOut,psVar1);
  peVar2 = clara::std::
           __shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x166181);
  std::__cxx11::string::operator=((string *)&peVar2->stdErr,(string *)(local_10 + 0x108));
  clara::std::
  shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>
  ::~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>
                 *)0x1661a1);
  return;
}

Assistant:

void testCaseEnded(TestCaseStats const& testCaseStats) override {
            auto node = std::make_shared<TestCaseNode>(testCaseStats);
            assert(m_sectionStack.size() == 0);
            node->children.push_back(m_rootSection);
            m_testCases.push_back(node);
            m_rootSection.reset();

            assert(m_deepestSection);
            m_deepestSection->stdOut = testCaseStats.stdOut;
            m_deepestSection->stdErr = testCaseStats.stdErr;
        }